

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke_test.cc
# Opt level: O0

void __thiscall
bssl::HPKETest_RecipientInvalidSeal_Test::TestBody(HPKETest_RecipientInvalidSeal_Test *this)

{
  bool bVar1;
  int iVar2;
  evp_hpke_key_st *peVar3;
  EVP_HPKE_KEM *kem;
  char *pcVar4;
  evp_hpke_ctx_st *peVar5;
  EVP_HPKE_KDF *kdf;
  EVP_HPKE_AEAD *aead;
  char *in_R9;
  string local_4e0;
  AssertHelper local_4c0;
  Message local_4b8;
  bool local_4a9;
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar__2;
  uint8_t ciphertext [100];
  size_t local_428;
  size_t ciphertext_len;
  AssertHelper local_400;
  Message local_3f8;
  int local_3ec;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar__1;
  ScopedEVP_HPKE_CTX recipient_ctx;
  string local_108;
  AssertHelper local_e8;
  Message local_e0 [3];
  int local_c4;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_;
  ScopedEVP_HPKE_KEY key;
  char kCleartextPayload [7];
  uint8_t kMockEnc [32];
  HPKETest_RecipientInvalidSeal_Test *this_local;
  
  _kCleartextPayload = 0xff;
  key.ctx_._108_3_ = 0x7261;
  key.ctx_.public_key[0x40] = 'f';
  key.ctx_._105_3_ = 0x626f6f;
  internal::
  StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
  ::StackAllocatedMovable
            ((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
              *)&gtest_ar_.message_);
  peVar3 = internal::
           StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
           ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                  *)&gtest_ar_.message_);
  kem = EVP_hpke_x25519_hkdf_sha256();
  local_c4 = EVP_HPKE_KEY_generate(peVar3,kem);
  testing::AssertionResult::AssertionResult<int>((AssertionResult *)local_c0,&local_c4,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_108,(internal *)local_c0,
               (AssertionResult *)"EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256())",
               "false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
               ,0x212,pcVar4);
    testing::internal::AssertHelper::operator=(&local_e8,local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    testing::Message::~Message(local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  if (bVar1) {
    internal::StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>::
    StackAllocated((StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>
                    *)&gtest_ar__1.message_);
    peVar5 = internal::
             StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>::get
                       ((StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>
                         *)&gtest_ar__1.message_);
    peVar3 = internal::
             StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
             ::get((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                    *)&gtest_ar_.message_);
    kdf = EVP_hpke_hkdf_sha256();
    aead = EVP_hpke_aes_128_gcm();
    pcVar4 = (char *)0x20;
    local_3ec = EVP_HPKE_CTX_setup_recipient
                          (peVar5,peVar3,kdf,aead,(uint8_t *)kCleartextPayload,0x20,(uint8_t *)0x0,0
                          );
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_3e8,&local_3ec,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
    if (!bVar1) {
      testing::Message::Message(&local_3f8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&ciphertext_len,(internal *)local_3e8,
                 (AssertionResult *)
                 "EVP_HPKE_CTX_setup_recipient( recipient_ctx.get(), key.get(), EVP_hpke_hkdf_sha256(), EVP_hpke_aes_128_gcm(), kMockEnc, sizeof(kMockEnc), nullptr, 0)"
                 ,"false","true",pcVar4);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_400,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                 ,0x218,pcVar4);
      testing::internal::AssertHelper::operator=(&local_400,&local_3f8);
      testing::internal::AssertHelper::~AssertHelper(&local_400);
      std::__cxx11::string::~string((string *)&ciphertext_len);
      testing::Message::~Message(&local_3f8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
    if (bVar1) {
      peVar5 = internal::
               StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>::get
                         ((StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>
                           *)&gtest_ar__1.message_);
      pcVar4 = (char *)0x7;
      iVar2 = EVP_HPKE_CTX_seal(peVar5,(uint8_t *)&gtest_ar__2.message_,&local_428,100,
                                key.ctx_.public_key + 0x40,7,(uint8_t *)0x0,0);
      local_4a9 = iVar2 == 0;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_4a8,&local_4a9,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a8);
      if (!bVar1) {
        testing::Message::Message(&local_4b8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_4e0,(internal *)local_4a8,
                   (AssertionResult *)
                   "EVP_HPKE_CTX_seal( recipient_ctx.get(), ciphertext, &ciphertext_len, sizeof(ciphertext), reinterpret_cast<const uint8_t *>(kCleartextPayload), sizeof(kCleartextPayload), nullptr, 0)"
                   ,"true","false",pcVar4);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_4c0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
                   ,0x220,pcVar4);
        testing::internal::AssertHelper::operator=(&local_4c0,&local_4b8);
        testing::internal::AssertHelper::~AssertHelper(&local_4c0);
        std::__cxx11::string::~string((string *)&local_4e0);
        testing::Message::~Message(&local_4b8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a8);
    }
    internal::StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>::
    ~StackAllocated((StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>
                     *)&gtest_ar__1.message_);
  }
  internal::
  StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
  ::~StackAllocatedMovable
            ((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
              *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(HPKETest, RecipientInvalidSeal) {
  const uint8_t kMockEnc[X25519_PUBLIC_VALUE_LEN] = {0xff};
  const char kCleartextPayload[] = "foobar";

  ScopedEVP_HPKE_KEY key;
  ASSERT_TRUE(EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256()));

  // Set up the recipient.
  ScopedEVP_HPKE_CTX recipient_ctx;
  ASSERT_TRUE(EVP_HPKE_CTX_setup_recipient(
      recipient_ctx.get(), key.get(), EVP_hpke_hkdf_sha256(),
      EVP_hpke_aes_128_gcm(), kMockEnc, sizeof(kMockEnc), nullptr, 0));

  // Call Seal() on the recipient.
  size_t ciphertext_len;
  uint8_t ciphertext[100];
  ASSERT_FALSE(EVP_HPKE_CTX_seal(
      recipient_ctx.get(), ciphertext, &ciphertext_len, sizeof(ciphertext),
      reinterpret_cast<const uint8_t *>(kCleartextPayload),
      sizeof(kCleartextPayload), nullptr, 0));
}